

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2crossing_edge_query.cc
# Opt level: O0

bool __thiscall
S2CrossingEdgeQuery::VisitCells
          (S2CrossingEdgeQuery *this,S2Point *a0,S2Point *a1,CellVisitor *visitor)

{
  VType VVar1;
  undefined8 this_00;
  bool bVar2;
  iterator pFVar3;
  ostream *poVar4;
  S2ShapeIndexCell *__args;
  S2PaddedCell local_288;
  undefined4 local_228;
  byte local_221;
  S2LogMessage local_220;
  S2LogMessageVoidify local_209;
  uint64 local_208;
  S2CellId local_200;
  uint64 local_1f8;
  CellRelation local_1ec;
  S2CellId SStack_1e8;
  CellRelation relation;
  S2CellId edge_root;
  undefined1 local_1d8 [8];
  S2PaddedCell pcell;
  R2Rect edge_bound;
  FaceSegment *segment;
  iterator __end1;
  iterator __begin1;
  FaceSegmentVector *__range1;
  undefined1 local_128 [8];
  FaceSegmentVector segments;
  CellVisitor *visitor_local;
  S2Point *a1_local;
  S2Point *a0_local;
  S2CrossingEdgeQuery *this_local;
  
  this->visitor_ = visitor;
  segments.rep_._232_8_ = visitor;
  absl::InlinedVector<S2::FaceSegment,_6UL,_std::allocator<S2::FaceSegment>_>::InlinedVector
            ((InlinedVector<S2::FaceSegment,_6UL,_std::allocator<S2::FaceSegment>_> *)local_128);
  S2::GetFaceSegments(a0,a1,(InlinedVector<S2::FaceSegment,_6UL,_std::allocator<S2::FaceSegment>_> *
                            )local_128);
  __end1 = absl::InlinedVector<S2::FaceSegment,_6UL,_std::allocator<S2::FaceSegment>_>::begin
                     ((InlinedVector<S2::FaceSegment,_6UL,_std::allocator<S2::FaceSegment>_> *)
                      local_128);
  pFVar3 = absl::InlinedVector<S2::FaceSegment,_6UL,_std::allocator<S2::FaceSegment>_>::end
                     ((InlinedVector<S2::FaceSegment,_6UL,_std::allocator<S2::FaceSegment>_> *)
                      local_128);
  do {
    if (__end1 == pFVar3) {
      this_local._7_1_ = true;
LAB_004707f8:
      local_228 = 1;
      absl::InlinedVector<S2::FaceSegment,_6UL,_std::allocator<S2::FaceSegment>_>::~InlinedVector
                ((InlinedVector<S2::FaceSegment,_6UL,_std::allocator<S2::FaceSegment>_> *)local_128)
      ;
      return this_local._7_1_;
    }
    VVar1 = (__end1->a).c_[1];
    (this->a0_).c_[0] = (__end1->a).c_[0];
    (this->a0_).c_[1] = VVar1;
    VVar1 = (__end1->b).c_[1];
    (this->a1_).c_[0] = (__end1->b).c_[0];
    (this->a1_).c_[1] = VVar1;
    R2Rect::FromPointPair((R2Rect *)&pcell.orientation_,&this->a0_,&this->a1_);
    edge_root = S2CellId::FromFace(__end1->face);
    S2PaddedCell::S2PaddedCell((S2PaddedCell *)local_1d8,edge_root,0.0);
    local_1f8 = (uint64)S2PaddedCell::ShrinkToFit
                                  ((S2PaddedCell *)local_1d8,(R2Rect *)&pcell.orientation_);
    SStack_1e8 = (S2CellId)local_1f8;
    local_1ec = S2ShapeIndex::Iterator::Locate(&this->iter_,(S2CellId)local_1f8);
    if (local_1ec == INDEXED) {
      local_221 = 0;
      local_200 = S2ShapeIndex::Iterator::id(&this->iter_);
      local_208 = SStack_1e8.id_;
      bVar2 = S2CellId::contains(&local_200,SStack_1e8);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        S2FatalLogMessage::S2FatalLogMessage
                  ((S2FatalLogMessage *)&local_220,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2crossing_edge_query.cc"
                   ,0xe4,kFatal,(ostream *)&std::cerr);
        local_221 = 1;
        poVar4 = S2LogMessage::stream(&local_220);
        poVar4 = std::operator<<(poVar4,"Check failed: iter_.id().contains(edge_root) ");
        S2LogMessageVoidify::operator&(&local_209,poVar4);
      }
      this_00 = segments.rep_._232_8_;
      if ((local_221 & 1) != 0) {
        S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_220);
      }
      __args = S2ShapeIndex::Iterator::cell(&this->iter_);
      bVar2 = std::function<bool_(const_S2ShapeIndexCell_&)>::operator()
                        ((function<bool_(const_S2ShapeIndexCell_&)> *)this_00,__args);
      if (!bVar2) {
        this_local._7_1_ = false;
        goto LAB_004707f8;
      }
    }
    else if (local_1ec == SUBDIVIDED) {
      bVar2 = S2CellId::is_face(&stack0xfffffffffffffe18);
      if (!bVar2) {
        S2PaddedCell::S2PaddedCell(&local_288,SStack_1e8,0.0);
        memcpy(local_1d8,&local_288,0x60);
      }
      bVar2 = VisitCells(this,(S2PaddedCell *)local_1d8,(R2Rect *)&pcell.orientation_);
      if (!bVar2) {
        this_local._7_1_ = false;
        goto LAB_004707f8;
      }
    }
    __end1 = __end1 + 1;
  } while( true );
}

Assistant:

bool S2CrossingEdgeQuery::VisitCells(const S2Point& a0, const S2Point& a1,
                                     const CellVisitor& visitor) {
  visitor_ = &visitor;
  S2::FaceSegmentVector segments;
  S2::GetFaceSegments(a0, a1, &segments);
  for (const auto& segment : segments) {
    a0_ = segment.a;
    a1_ = segment.b;

    // Optimization: rather than always starting the recursive subdivision at
    // the top level face cell, instead we start at the smallest S2CellId that
    // contains the edge (the "edge root cell").  This typically lets us skip
    // quite a few levels of recursion since most edges are short.
    R2Rect edge_bound = R2Rect::FromPointPair(a0_, a1_);
    S2PaddedCell pcell(S2CellId::FromFace(segment.face), 0);
    S2CellId edge_root = pcell.ShrinkToFit(edge_bound);

    // Now we need to determine how the edge root cell is related to the cells
    // in the spatial index (cell_map_).  There are three cases:
    //
    //  1. edge_root is an index cell or is contained within an index cell.
    //     In this case we only need to look at the contents of that cell.
    //  2. edge_root is subdivided into one or more index cells.  In this case
    //     we recursively subdivide to find the cells intersected by a0a1.
    //  3. edge_root does not intersect any index cells.  In this case there
    //     is nothing to do.
    S2ShapeIndex::CellRelation relation = iter_.Locate(edge_root);
    if (relation == S2ShapeIndex::INDEXED) {
      // edge_root is an index cell or is contained by an index cell (case 1).
      S2_DCHECK(iter_.id().contains(edge_root));
      if (!visitor(iter_.cell())) return false;
    } else if (relation == S2ShapeIndex::SUBDIVIDED) {
      // edge_root is subdivided into one or more index cells (case 2).  We
      // find the cells intersected by a0a1 using recursive subdivision.
      if (!edge_root.is_face()) pcell = S2PaddedCell(edge_root, 0);
      if (!VisitCells(pcell, edge_bound)) return false;
    }
  }
  return true;
}